

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

float TcDistanceHelper(ON_2fPoint *tc)

{
  float local_2c;
  float local_28;
  float local_24;
  float dy;
  float dx;
  ON_2fPoint *tc_local;
  
  if (tc->x <= 0.5) {
    local_24 = tc->x;
  }
  else {
    local_24 = 1.0 - tc->x;
  }
  if (0.0 <= local_24) {
    if (tc->y <= 0.5) {
      local_28 = tc->y;
    }
    else {
      local_28 = 1.0 - tc->y;
    }
    if (0.0 <= local_28) {
      if (local_28 <= local_24) {
        local_2c = local_28;
      }
      else {
        local_2c = local_24;
      }
      tc_local._4_4_ = local_2c;
    }
    else {
      tc_local._4_4_ = 0.0;
    }
  }
  else {
    tc_local._4_4_ = 0.0;
  }
  return tc_local._4_4_;
}

Assistant:

static
float TcDistanceHelper(const ON_2fPoint& tc)
{
  float dx = (tc.x > 0.5f) ? (1.0f-tc.x) : tc.x;
  if ( dx < 0.0f)
    return 0.0f;
  float dy = (tc.y > 0.5f) ? (1.0f-tc.y) : tc.y;
  if ( dy < 0.0f)
    return 0.0f;
  return (dx < dy) ? dx : dy;
}